

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TimingCheckEventConditionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingCheckEventConditionSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  TimingCheckEventConditionSyntax *pTVar6;
  
  pTVar6 = (TimingCheckEventConditionSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TimingCheckEventConditionSyntax *)this->endPtr < pTVar6 + 1) {
    pTVar6 = (TimingCheckEventConditionSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pTVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pTVar6->super_SyntaxNode).kind = TimingCheckEventCondition;
  (pTVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pTVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pTVar6->tripleAnd).kind = TVar2;
  (pTVar6->tripleAnd).field_0x2 = uVar3;
  (pTVar6->tripleAnd).numFlags = (NumericTokenFlags)NVar4.raw;
  (pTVar6->tripleAnd).rawLen = uVar5;
  (pTVar6->tripleAnd).info = pIVar1;
  (pTVar6->expr).ptr = args_1;
  (args_1->super_SyntaxNode).parent = &pTVar6->super_SyntaxNode;
  return pTVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }